

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_append_insn(MIR_context_t ctx,MIR_item_t_conflict func_item,MIR_insn_t_conflict insn)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  MIR_error_func_t p_Var3;
  code *pcVar4;
  VARR_uint8_t *pVVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  MIR_error_type_t MVar13;
  size_t sVar14;
  MIR_error_func_t p_Var15;
  MIR_insn_t_conflict pMVar16;
  ulong uVar17;
  long lVar18;
  ulong nops;
  size_t unaff_RBX;
  undefined8 *puVar19;
  MIR_context_t *ppMVar20;
  undefined8 *puVar21;
  MIR_context_t *ppMVar22;
  MIR_insn_code_t code;
  char *pcVar23;
  char *pcVar24;
  MIR_context_t pMVar25;
  MIR_context_t unaff_R12;
  MIR_proto_t unaff_R13;
  ulong uVar26;
  bool bVar27;
  undefined8 uStack_b8;
  MIR_context_t pMStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  MIR_var_t MStack_98;
  MIR_var_t MStack_80;
  MIR_var_t MStack_68;
  MIR_var_t MStack_50;
  
  if (func_item == (MIR_item_t_conflict)0x0) {
    __assert_fail("func_item != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xa62,"void MIR_append_insn(MIR_context_t, MIR_item_t, MIR_insn_t)");
  }
  if (func_item->item_type == MIR_func_item) {
    DLIST_MIR_insn_t_append(&((func_item->u).func)->insns,insn);
    return;
  }
  pcVar23 = "MIR_append_insn: wrong func item";
  pMVar25 = (MIR_context_t)0xb;
  (*ctx->error_func)(MIR_wrong_param_value_error,"MIR_append_insn: wrong func item");
  ppMVar22 = &pMStack_b0;
  ppMVar20 = &pMStack_b0;
  code = (MIR_insn_code_t)pcVar23;
  uStack_b8 = 0x1123f9;
  pMStack_b0 = pMVar25;
  sVar14 = insn_code_nops(pMVar25,code);
  pMVar25 = pMStack_b0;
  if (ctx == (MIR_context_t)0x0 && nops != 0) {
    uStack_b8 = 0x11275f;
    __assert_fail("nops == 0 || ops != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x890,
                  "MIR_insn_t MIR_new_insn_arr(MIR_context_t, MIR_insn_code_t, size_t, MIR_op_t *)")
    ;
  }
  uStack_a8 = (ulong)pcVar23 & 0xffffffff;
  if (code - MIR_SWITCH < 0xfffffffd) {
    if (code != MIR_SWITCH) {
      if (((code == MIR_RET) || (code == MIR_UNSPEC)) || (code == MIR_USE)) goto LAB_0011247c;
      if (code == MIR_PHI) goto LAB_00112510;
      if (sVar14 == nops) goto LAB_00112452;
      pcVar24 = "wrong number of operands for insn %s";
      pcVar23 = insn_descs[(ulong)pcVar23 & 0xffffffff].name;
      MVar13 = MIR_ops_num_error;
LAB_001127a1:
      uStack_b8 = 0x1127ab;
      (*(code *)pMStack_b0->error_func)(MVar13,pcVar24,pcVar23);
LAB_001127ab:
      pVVar5 = (VARR_uint8_t *)pMStack_b0->error_func;
      uStack_b8 = 0x1127c7;
      VARR_MIR_var_tget(&MStack_50,unaff_R13->args,unaff_RBX);
      pcVar23 = "call";
      if ((int)uStack_a8 == 0xb5) {
        pcVar23 = "unspec";
      }
      uStack_b8 = 0x1127f8;
      (*(code *)pVVar5)(MIR_wrong_type_error,
                        "different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                        MStack_50.size,unaff_R12->gen_ctx,pcVar23);
LAB_001127f8:
      pcVar23 = "call";
      if ((int)uStack_a8 == 0xb5) {
        pcVar23 = "unspec";
      }
      uStack_b8 = 0x112830;
      (*(code *)pMStack_b0->error_func)
                ((int)uStack_a8 == 0xb5 | MIR_call_op_error,
                 "number of %s operands or results does not correspond to prototype %s",pcVar23,
                 unaff_R13->name);
      goto LAB_00112830;
    }
  }
  else {
LAB_00112452:
    if (code == MIR_PHI) {
LAB_00112510:
      if (2 < nops) goto LAB_0011251a;
LAB_00112830:
      pcVar23 = "number of MIR_PHI operands is less 3";
      goto LAB_00112840;
    }
    if (code != MIR_SWITCH) {
LAB_0011247c:
      if (2 < code - MIR_CALL) {
        if (code == MIR_VA_ARG) {
          if (*(char *)&(ctx->environment_module).items.tail != '\n') {
            pcVar23 = "3rd operand of va_arg should be any memory with given type";
            pMVar25 = unaff_R12;
            goto LAB_0011286f;
          }
          goto LAB_0011251a;
        }
        if (code == MIR_PRSET) {
          if (*(char *)&ctx->temp_data != '\x03') goto LAB_00112868;
          goto LAB_0011251a;
        }
        if (code != MIR_UNSPEC) {
          if (code - MIR_PRBEQ < 2) {
            ppMVar20 = &pMStack_b0;
            if (*(char *)&(ctx->environment_module).items.tail != '\x03') goto LAB_00112868;
            if ((*(char *)&ctx->temp_data != '\x01') && (*(char *)&ctx->temp_data != '\n')) {
              pcVar23 = "2nd operand of property branch should be any memory or reg with given type"
              ;
              ppMVar22 = &pMStack_b0;
              pMVar25 = unaff_R12;
              goto LAB_0011286f;
            }
          }
          goto LAB_0011251a;
        }
      }
      uStack_a0 = (ulong)(code != MIR_UNSPEC) + 1;
      if (nops < uStack_a0) {
        pcVar23 = "wrong number of call/unspec operands";
        goto LAB_00112840;
      }
      if (code == MIR_UNSPEC) {
        ppMVar20 = &pMStack_b0;
        if (*(char *)&ctx->c2mir_ctx != '\x03') goto LAB_0011284c;
        p_Var3 = ctx->error_func;
        uStack_b8 = 0x1124f4;
        p_Var15 = (MIR_error_func_t)
                  VARR_MIR_proto_tlength
                            ((VARR_MIR_proto_t *)((MIR_module *)&pMStack_b0->unspec_protos)->data);
        ppMVar20 = &pMStack_b0;
        if (p_Var15 <= p_Var3) goto LAB_0011284c;
        uStack_b8 = 0x11250b;
        unaff_R13 = VARR_MIR_proto_tget((VARR_MIR_proto_t *)
                                        ((MIR_module *)&pMVar25->unspec_protos)->data,
                                        (size_t)ctx->error_func);
      }
      else {
        if ((*(char *)&ctx->c2mir_ctx != '\b') || (*(int *)(ctx->error_func + 0x20) != 1)) {
          pcVar23 = "the 1st call operand should be a prototype";
          puVar21 = &uStack_b8;
          uStack_b8 = 0x16;
          unaff_R12 = pMStack_b0;
          goto LAB_00112860;
        }
        unaff_R13 = *(MIR_proto_t *)(ctx->error_func + 0x40);
      }
      uVar26 = (ulong)unaff_R13->nres;
      if (unaff_R13->args != (VARR_MIR_var_t *)0x0) {
        uVar26 = uVar26 + unaff_R13->args->els_num;
      }
      unaff_R12 = pMVar25;
      if ((uVar26 + uStack_a0 <= nops) &&
         ((uVar26 + uStack_a0 == nops || (unaff_R13->vararg_p != '\0')))) {
        unaff_R12 = (MIR_context_t)(&ctx->unspec_protos + uStack_a0 * 6);
        for (uVar26 = 0; uStack_a0 + uVar26 < nops; uVar26 = uVar26 + 1) {
          if (*(char *)&unaff_R12[-1].hard_reg_ctx == '\n') {
            uVar17 = (ulong)unaff_R13->nres;
            if (*(byte *)&unaff_R12[-1].interp_ctx - 0x12 < 0xfffffffa) goto LAB_0011264c;
            unaff_RBX = uVar26 - uVar17;
            if (uVar26 < uVar17) {
              bVar27 = (int)uStack_a8 == 0xb5;
              pcVar24 = "result of %s is block type memory";
LAB_0011279b:
              pcVar23 = "call";
              if (bVar27) {
                pcVar23 = "unspec";
              }
              MVar13 = MIR_wrong_type_error;
              goto LAB_001127a1;
            }
            uStack_b8 = 0x1125fd;
            sVar14 = VARR_MIR_var_tlength(unaff_R13->args);
            if (unaff_RBX < sVar14) {
              uStack_b8 = 0x112617;
              VARR_MIR_var_tget(&MStack_68,unaff_R13->args,unaff_RBX);
              if (MStack_68.type != *(byte *)&unaff_R12[-1].interp_ctx) {
                bVar27 = (int)uStack_a8 == 0xb5;
                pcVar24 = "arg of %s is block type memory but param is not of block type";
                goto LAB_0011279b;
              }
              uStack_b8 = 0x112638;
              VARR_MIR_var_tget(&MStack_80,unaff_R13->args,unaff_RBX);
              if ((gen_ctx *)MStack_80.size != unaff_R12->gen_ctx) goto LAB_001127ab;
            }
            else if (*(char *)&unaff_R12[-1].interp_ctx == '\x11') {
              bVar27 = (int)uStack_a8 == 0xb5;
              pcVar24 = "RBLK memory can not correspond to unnamed param in %s insn";
              goto LAB_0011279b;
            }
          }
          else {
            uVar17 = (ulong)unaff_R13->nres;
LAB_0011264c:
            unaff_RBX = uVar26 - uVar17;
            if (uVar17 <= uVar26) {
              uStack_b8 = 0x11265f;
              sVar14 = VARR_MIR_var_tlength(unaff_R13->args);
              if (unaff_RBX < sVar14) {
                uStack_b8 = 0x112675;
                VARR_MIR_var_tget(&MStack_98,unaff_R13->args,unaff_RBX);
                if (0xfffffff9 < MStack_98.type - MIR_T_UNDEF) {
                  bVar27 = (int)uStack_a8 == 0xb5;
                  pcVar24 = "param of %s is of block type but arg is not of block type memory";
                  goto LAB_0011279b;
                }
              }
            }
          }
          unaff_R12 = (MIR_context_t)&unaff_R12->temp_string;
        }
        goto LAB_0011251a;
      }
      goto LAB_001127f8;
    }
  }
  if (1 < nops) {
LAB_0011251a:
    uStack_b8 = 0x11252b;
    pMVar16 = create_insn(pMStack_b0,nops,(MIR_insn_code_t)uStack_a8);
    *(int *)&pMVar16->field_0x1c = (int)nops;
    lVar18 = 0x20;
    uVar26 = nops;
    while (bVar27 = uVar26 != 0, uVar26 = uVar26 - 1, bVar27) {
      puVar1 = (undefined8 *)((long)ctx + lVar18 + -0x20);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      uVar8 = puVar1[2];
      uVar9 = puVar1[3];
      puVar1 = (undefined8 *)((long)ctx + lVar18 + -0x10);
      uVar10 = puVar1[1];
      uVar11 = puVar1[2];
      uVar12 = puVar1[3];
      puVar2 = (undefined8 *)((long)pMVar16->ops + lVar18 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar2[2] = uVar11;
      puVar2[3] = uVar12;
      puVar1 = (undefined8 *)((long)pMVar16->ops + lVar18 + -0x20);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1[2] = uVar8;
      puVar1[3] = uVar9;
      lVar18 = lVar18 + 0x30;
    }
    return;
  }
  pcVar23 = "number of MIR_SWITCH operands is less 2";
LAB_00112840:
  puVar19 = &uStack_b8;
  uStack_b8 = 0x15;
  pMVar25 = unaff_R12;
  do {
    uVar6 = *puVar19;
    pcVar4 = *(code **)(puVar19[1] + 0x10);
    *puVar19 = 0x11284c;
    (*pcVar4)(uVar6,pcVar23);
    ppMVar20 = (MIR_context_t *)(puVar19 + 1);
LAB_0011284c:
    pcVar23 = "the 1st unspec operand should be valid unspec code";
    puVar21 = (undefined8 *)((long)ppMVar20 + -8);
    *(undefined8 *)((long)ppMVar20 + -8) = 0x17;
    unaff_R12 = pMVar25;
LAB_00112860:
    uVar6 = *puVar21;
    pVVar5 = (VARR_uint8_t *)unaff_R12->error_func;
    *puVar21 = 0x112868;
    (*(code *)pVVar5)((MIR_error_type_t)uVar6,pcVar23);
    ppMVar20 = (MIR_context_t *)(puVar21 + 1);
LAB_00112868:
    pcVar23 = "property should be a integer operand";
    ppMVar22 = ppMVar20;
    pMVar25 = unaff_R12;
LAB_0011286f:
    puVar19 = (undefined8 *)((long)ppMVar22 + -8);
    *(undefined8 *)((long)ppMVar22 + -8) = 0x1a;
  } while( true );
}

Assistant:

void MIR_append_insn (MIR_context_t ctx, MIR_item_t func_item, MIR_insn_t insn) {
  mir_assert (func_item != NULL);
  if (func_item->item_type != MIR_func_item)
    MIR_get_error_func (ctx) (MIR_wrong_param_value_error, "MIR_append_insn: wrong func item");
  DLIST_APPEND (MIR_insn_t, func_item->u.func->insns, insn);
}